

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkqueue.h
# Opt level: O2

void __thiscall
CCheckQueue<FakeCheckCheckCompletion>::CCheckQueue
          (CCheckQueue<FakeCheckCheckCompletion> *this,uint batch_size,int worker_threads_num)

{
  int iVar1;
  long in_FS_OFFSET;
  anon_class_16_2_fd512ddb_for__M_head_impl local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)((long)&(this->m_mutex).super_mutex.super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_mutex).super_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_mutex).super_mutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_mutex).super_mutex.super___mutex_base._M_mutex + 8) = 0;
  (this->m_mutex).super_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&this->m_worker_cv);
  std::condition_variable::condition_variable(&this->m_master_cv);
  (this->queue).
  super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->nIdle = 0;
  this->nTotal = 0;
  (this->queue).
  super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->queue).
  super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->fAllOk = true;
  this->nTodo = 0;
  this->nBatchSize = batch_size;
  (this->m_control_mutex).super_mutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_control_mutex).super_mutex.super___mutex_base._M_mutex + 8) = 0;
  (this->m_control_mutex).super_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->m_control_mutex).super_mutex.super___mutex_base._M_mutex + 0x10) = 0
  ;
  (this->m_control_mutex).super_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_worker_threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_worker_threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->m_worker_threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->m_worker_threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  std::vector<std::thread,_std::allocator<std::thread>_>::reserve
            (&this->m_worker_threads,(long)worker_threads_num);
  iVar1 = 0;
  if (worker_threads_num < 1) {
    worker_threads_num = 0;
  }
  for (; worker_threads_num != iVar1; iVar1 = iVar1 + 1) {
    local_48.this = this;
    local_48.n = iVar1;
    std::vector<std::thread,std::allocator<std::thread>>::
    emplace_back<CCheckQueue<FakeCheckCheckCompletion>::CCheckQueue(unsigned_int,int)::_lambda()_1_>
              ((vector<std::thread,std::allocator<std::thread>> *)&this->m_worker_threads,&local_48)
    ;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit CCheckQueue(unsigned int batch_size, int worker_threads_num)
        : nBatchSize(batch_size)
    {
        m_worker_threads.reserve(worker_threads_num);
        for (int n = 0; n < worker_threads_num; ++n) {
            m_worker_threads.emplace_back([this, n]() {
                util::ThreadRename(strprintf("scriptch.%i", n));
                Loop(false /* worker thread */);
            });
        }
    }